

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall clickhouse::SocketOutput::DoWrite(SocketOutput *this,void *data,size_t len)

{
  ssize_t sVar1;
  undefined8 uVar2;
  int *piVar3;
  undefined8 in_RDX;
  system_error *in_RSI;
  long in_RDI;
  int iVar4;
  undefined4 in_stack_ffffffffffffffdc;
  error_category *in_stack_ffffffffffffffe0;
  int __v;
  
  sVar1 = send(*(int *)(in_RDI + 8),in_RSI,(long)(int)in_RDX,0x4000);
  if (sVar1 != (int)in_RDX) {
    uVar2 = __cxa_allocate_exception(0x20);
    __v = (int)((ulong)in_RDX >> 0x20);
    piVar3 = __errno_location();
    iVar4 = *piVar3;
    std::_V2::system_category();
    std::system_error::system_error
              (in_RSI,__v,in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,iVar4));
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

void SocketOutput::DoWrite(const void* data, size_t len) {
#if defined (_linux_)
    static const int flags = MSG_NOSIGNAL;
#else
    static const int flags = 0;
#endif

    if (::send(s_, (const char*)data, (int)len, flags) != (int)len) {
        throw std::system_error(
            errno, std::system_category(), "fail to send data"
        );
    }
}